

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_image.cxx
# Opt level: O0

void __thiscall
Fl_PostScript_Graphics_Driver::draw
          (Fl_PostScript_Graphics_Driver *this,Fl_Bitmap *bitmap,int XP,int YP,int WP,int HP,int cx,
          int cy)

{
  uchar b;
  int iVar1;
  int iVar2;
  void *data;
  void *rle85;
  int local_48;
  int j;
  int i;
  int si;
  int xx;
  int LD;
  int h;
  int w;
  uchar *di;
  int HP_local;
  int WP_local;
  int YP_local;
  int XP_local;
  Fl_Bitmap *bitmap_local;
  Fl_PostScript_Graphics_Driver *this_local;
  
  _h = bitmap->array;
  iVar1 = Fl_Image::w(&bitmap->super_Fl_Image);
  iVar2 = Fl_Image::w(&bitmap->super_Fl_Image);
  if (iVar2 - cx < WP) {
    iVar2 = Fl_Image::w(&bitmap->super_Fl_Image);
    LD = iVar2 - cx;
    iVar2 = Fl_Image::w(&bitmap->super_Fl_Image);
    i = (iVar2 + 7) / 8 - cx / 8;
  }
  else {
    i = (WP + 7) / 8 - cx / 8;
    LD = WP;
  }
  iVar2 = Fl_Image::h(&bitmap->super_Fl_Image);
  xx = HP;
  if (iVar2 - cy < HP) {
    iVar2 = Fl_Image::h(&bitmap->super_Fl_Image);
    xx = iVar2 - cy;
  }
  _h = _h + (cy * ((iVar1 + 7) / 8) + cx / 8);
  (*(this->super_Fl_Graphics_Driver).super_Fl_Device._vptr_Fl_Device[0x2a])
            (this,(ulong)(uint)XP,(ulong)(uint)YP,(ulong)(uint)WP,(ulong)(uint)HP);
  fprintf((FILE *)this->output,"%i %i %i %i %i %i MI\n",(ulong)(uint)(XP - cx % 8),
          (ulong)(uint)(YP + HP),(ulong)(uint)WP,(ulong)(uint)-HP,LD,xx);
  data = prepare_rle85(this);
  for (rle85._4_4_ = 0; rle85._4_4_ < HP; rle85._4_4_ = rle85._4_4_ + 1) {
    for (local_48 = 0; local_48 < i; local_48 = local_48 + 1) {
      b = swap_byte(*_h);
      write_rle85(this,b,data);
      _h = _h + 1;
    }
  }
  close_rle85(this,data);
  fputc(10,(FILE *)this->output);
  (*(this->super_Fl_Graphics_Driver).super_Fl_Device._vptr_Fl_Device[0x2e])();
  return;
}

Assistant:

void Fl_PostScript_Graphics_Driver::draw(Fl_Bitmap * bitmap,int XP, int YP, int WP, int HP, int cx, int cy){
  const uchar  * di = bitmap->array;
  int w,h;
  int LD=(bitmap->w()+7)/8;
  int xx;

  if (WP> bitmap->w() - cx){// to assure that it does not go out of bounds;
     w = bitmap->w() - cx;
     xx = (bitmap->w()+7)/8 - cx/8; //length of mask in bytes
  }else{
    w =WP;
    xx = (w+7)/8 - cx/8;
  }
  if ( HP > bitmap->h()-cy)
    h = bitmap->h() - cy;
  else
    h = HP;

  di += cy*LD + cx/8;
  int si = cx % 8; // small shift to be clipped, it is simpler than shifting whole mask

  int i,j;
  push_clip(XP, YP, WP, HP);
  fprintf(output , "%i %i %i %i %i %i MI\n", XP - si, YP + HP , WP , -HP , w , h);

  void *rle85 = prepare_rle85();
  for (j=0; j<HP; j++){
    for (i=0; i<xx; i++){
      write_rle85(swap_byte(*di), rle85);
      di++;
    }
  }
  close_rle85(rle85); fputc('\n', output);
  pop_clip();
}